

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmJsr<(moira::Instr)66,(moira::Mode)9,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Ea<(moira::Mode)9,_(moira::Size)4> *in_stack_00000008;
  StrWriter *in_stack_00000010;
  Ea<(moira::Mode)9,_(moira::Size)4> src;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  
  Op<(moira::Mode)9,(moira::Size)4>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,in_RDI);
  this_00 = StrWriter::operator<<(in_RSI);
  StrWriter::operator<<(this_00,(Align)in_RDI[5]);
  StrWriter::operator<<(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void
Moira::dasmJsr(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> (_____________xxx(op), addr);

    str << Ins<I>{} << tab << src;
}